

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

int __thiscall QMetaObject::indexOfProperty(QMetaObject *this,char *name)

{
  uint uVar1;
  uint *puVar2;
  Data *pDVar3;
  int iVar4;
  QMetaObject *pQVar5;
  long lVar6;
  uint *puVar7;
  int iVar8;
  
  pQVar5 = this;
  do {
    puVar7 = (pQVar5->d).data;
    uVar1 = puVar7[6];
    if (0 < (long)(int)uVar1) {
      puVar7 = puVar7 + (int)puVar7[7];
      puVar2 = (pQVar5->d).stringdata;
      lVar6 = 0;
      do {
        iVar4 = strcmp(name,(char *)((ulong)puVar2[(long)(int)*puVar7 * 2] + (long)puVar2));
        if (iVar4 == 0) {
          pQVar5 = (pQVar5->d).superdata.direct;
          if (pQVar5 != (QMetaObject *)0x0) {
            iVar4 = 0;
            do {
              iVar8 = iVar4;
              pDVar3 = &pQVar5->d;
              pQVar5 = (pQVar5->d).superdata.direct;
              uVar1 = pDVar3->data[6];
              iVar4 = uVar1 + iVar8;
            } while (pQVar5 != (QMetaObject *)0x0);
            return (uVar1 + iVar8) - (int)lVar6;
          }
          return -(int)lVar6;
        }
        lVar6 = lVar6 + -1;
        puVar7 = puVar7 + 5;
      } while (-lVar6 != (long)(int)uVar1);
    }
    pQVar5 = (pQVar5->d).superdata.direct;
  } while (pQVar5 != (QMetaObject *)0x0);
  if (((this->d).data[0xc] & 1) == 0) {
    return -1;
  }
  iVar4 = (**(code **)((long)this[-1].d.extradata + 0x28))(&this[-1].d.extradata,name,0);
  return iVar4;
}

Assistant:

int QMetaObject::indexOfProperty(const char *name) const
{
    const QMetaObject *m = this;
    while (m) {
        const QMetaObjectPrivate *d = priv(m->d.data);
        for (int i = 0; i < d->propertyCount; ++i) {
            const QMetaProperty::Data data = QMetaProperty::getMetaPropertyData(m, i);
            const char *prop = rawStringData(m, data.name());
            if (strcmp(name, prop) == 0) {
                i += m->propertyOffset();
                return i;
            }
        }
        m = m->d.superdata;
    }

    if (priv(this->d.data)->flags & DynamicMetaObject) {
        QAbstractDynamicMetaObject *me =
            const_cast<QAbstractDynamicMetaObject *>(static_cast<const QAbstractDynamicMetaObject *>(this));

        return me->createProperty(name, nullptr);
    }

    return -1;
}